

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s3_both.cc
# Opt level: O1

bool __thiscall bssl::tls_append_handshake_data(bssl *this,SSL *ssl,Span<const_unsigned_char> data)

{
  long lVar1;
  int iVar2;
  BUF_MEM *__p;
  bool bVar3;
  
  lVar1 = *(long *)(this + 0x30);
  if (*(long *)(lVar1 + 0xe0) == 0) {
    __p = BUF_MEM_new();
    std::__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter>::reset
              ((__uniq_ptr_impl<buf_mem_st,_bssl::internal::Deleter> *)(lVar1 + 0xe0),(pointer)__p);
  }
  if (*(BUF_MEM **)(*(long *)(this + 0x30) + 0xe0) == (BUF_MEM *)0x0) {
    bVar3 = false;
  }
  else {
    iVar2 = BUF_MEM_append(*(BUF_MEM **)(*(long *)(this + 0x30) + 0xe0),ssl,(size_t)data.data_);
    bVar3 = iVar2 != 0;
  }
  return bVar3;
}

Assistant:

bool tls_append_handshake_data(SSL *ssl, Span<const uint8_t> data) {
  // Re-create the handshake buffer if needed.
  if (!ssl->s3->hs_buf) {
    ssl->s3->hs_buf.reset(BUF_MEM_new());
  }
  return ssl->s3->hs_buf &&
         BUF_MEM_append(ssl->s3->hs_buf.get(), data.data(), data.size());
}